

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O1

void Abc_NtkManCutStop(Abc_ManCut_t *p)

{
  Vec_Ptr_t *pVVar1;
  Vec_Vec_t *__ptr;
  void *__ptr_00;
  long lVar2;
  
  pVVar1 = p->vNodeLeaves;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vConeLeaves;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vVisited;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  __ptr = p->vLevels;
  if (0 < __ptr->nSize) {
    lVar2 = 0;
    do {
      __ptr_00 = __ptr->pArray[lVar2];
      if (__ptr_00 != (void *)0x0) {
        if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr_00 + 8));
          *(undefined8 *)((long)__ptr_00 + 8) = 0;
        }
        free(__ptr_00);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Vec_t *)0x0) {
    free(__ptr);
  }
  pVVar1 = p->vNodesTfo;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  if (p != (Abc_ManCut_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Abc_NtkManCutStop( Abc_ManCut_t * p )
{
    Vec_PtrFree( p->vNodeLeaves );
    Vec_PtrFree( p->vConeLeaves );
    Vec_PtrFree( p->vVisited    );
    Vec_VecFree( p->vLevels );
    Vec_PtrFree( p->vNodesTfo );
    ABC_FREE( p );
}